

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_struct_thrift_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_result,bool is_private)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  pointer pptVar5;
  string local_70;
  string access;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"extension ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar3," : TStruct");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if (this->gen_cocoa_ == false) {
    pcVar4 = "public";
    if (is_private) {
      pcVar4 = "fileprivate";
    }
    std::__cxx11::string::string((string *)&access,pcVar4,(allocator *)&local_70);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,(string *)&access);
    std::operator<<(poVar3," static var fieldIds: [String: Int32]");
    std::__cxx11::string::~string((string *)&local_70);
    block_open(this,out);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_70);
    std::operator<<(poVar3,"return [");
    std::__cxx11::string::~string((string *)&local_70);
    bVar1 = false;
    for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      poVar3 = std::operator<<(out,"\"");
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
      poVar3 = std::operator<<(poVar3,"\": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar5)->key_);
      std::operator<<(poVar3,", ");
      bVar1 = true;
    }
    if (!bVar1) {
      std::operator<<(out,":");
    }
    poVar3 = std::operator<<(out,"]");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,(string *)&access);
    poVar3 = std::operator<<(poVar3," static var structName: String { return \"");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    poVar3 = std::operator<<(poVar3,"\" }");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    if (tstruct->is_union_ == true) {
      generate_swift_union_reader(this,out,tstruct);
    }
    else {
      generate_swift_struct_reader(this,out,tstruct,is_private);
    }
    std::__cxx11::string::~string((string *)&access);
  }
  else {
    generate_swift_struct_reader(this,out,tstruct,is_private);
    if (is_result) {
      generate_old_swift_struct_result_writer(this,out,tstruct);
    }
    else {
      generate_old_swift_struct_writer(this,out,tstruct,is_private);
    }
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_thrift_extension(ostream& out,
                                                               t_struct* tstruct,
                                                               bool is_result,
                                                               bool is_private) {

  indent(out) << "extension " << tstruct->get_name() << " : TStruct";

  block_open(out);

  out << endl;
  if (!gen_cocoa_) {
    /** Swift 3, no writer we just write field ID's */
    string access = (is_private) ? (gen_cocoa_ ? "private" : "fileprivate") : "public";
    // generate fieldID's dictionary
    out << indent() << access << " static var fieldIds: [String: Int32]";
    block_open(out);
    out << indent() << "return [";
    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;
    bool wrote = false;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      wrote = true;
      out << "\"" << (*f_iter)->get_name() << "\": " << (*f_iter)->get_key() << ", ";
    }
    if (!wrote) {
      // pad a colon
      out << ":";
    }
    out << "]" << endl;
    block_close(out);
    out << endl;
    out << indent() << access << " static var structName: String { return \""
        << tstruct->get_name() << "\" }" << endl << endl;

    if (tstruct->is_union()) {
      generate_swift_union_reader(out, tstruct);
    } else {
      generate_swift_struct_reader(out, tstruct, is_private);
    }
  } else {
    /** Legacy Swift2/Cocoa */

    generate_swift_struct_reader(out, tstruct, is_private);

    if (is_result) {
      generate_old_swift_struct_result_writer(out, tstruct);
    }
    else {
      generate_old_swift_struct_writer(out, tstruct, is_private);
    }
  }

  block_close(out);
  out << endl;
}